

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O0

unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
 __thiscall
draco::SequentialAttributeDecodersController::CreateSequentialDecoder
          (SequentialAttributeDecodersController *this,uint8_t decoder_type)

{
  unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
  *this_00;
  pointer __p;
  undefined1 in_DL;
  __uniq_ptr_data<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>,_true,_true>
  in_RDI;
  pointer in_stack_ffffffffffffff98;
  SequentialIntegerAttributeDecoder *in_stack_ffffffffffffffa0;
  unique_ptr<draco::SequentialNormalAttributeDecoder,_std::default_delete<draco::SequentialNormalAttributeDecoder>_>
  *in_stack_ffffffffffffffa8;
  SequentialQuantizationAttributeDecoder *in_stack_ffffffffffffffb0;
  
  switch(in_DL) {
  case 0:
    operator_new(0x28);
    SequentialAttributeDecoder::SequentialAttributeDecoder((SequentialAttributeDecoder *)0x1de4c4);
    std::
    unique_ptr<draco::SequentialAttributeDecoder,std::default_delete<draco::SequentialAttributeDecoder>>
    ::unique_ptr<std::default_delete<draco::SequentialAttributeDecoder>,void>
              ((unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
                *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 1:
    operator_new(0x30);
    SequentialIntegerAttributeDecoder::SequentialIntegerAttributeDecoder(in_stack_ffffffffffffffa0);
    std::
    unique_ptr<draco::SequentialAttributeDecoder,std::default_delete<draco::SequentialAttributeDecoder>>
    ::unique_ptr<std::default_delete<draco::SequentialAttributeDecoder>,void>
              ((unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
                *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 2:
    this_00 = (unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
               *)operator_new(0x60);
    SequentialQuantizationAttributeDecoder::SequentialQuantizationAttributeDecoder
              (in_stack_ffffffffffffffb0);
    std::
    unique_ptr<draco::SequentialAttributeDecoder,std::default_delete<draco::SequentialAttributeDecoder>>
    ::unique_ptr<std::default_delete<draco::SequentialAttributeDecoder>,void>
              (this_00,in_stack_ffffffffffffff98);
    break;
  case 3:
    __p = (pointer)operator_new(0x40);
    SequentialNormalAttributeDecoder::SequentialNormalAttributeDecoder
              ((SequentialNormalAttributeDecoder *)in_stack_ffffffffffffffb0);
    std::
    unique_ptr<draco::SequentialNormalAttributeDecoder,std::default_delete<draco::SequentialNormalAttributeDecoder>>
    ::unique_ptr<std::default_delete<draco::SequentialNormalAttributeDecoder>,void>
              ((unique_ptr<draco::SequentialNormalAttributeDecoder,_std::default_delete<draco::SequentialNormalAttributeDecoder>_>
                *)in_stack_ffffffffffffffa0,__p);
    std::
    unique_ptr<draco::SequentialAttributeDecoder,std::default_delete<draco::SequentialAttributeDecoder>>
    ::
    unique_ptr<draco::SequentialNormalAttributeDecoder,std::default_delete<draco::SequentialNormalAttributeDecoder>,void>
              ((unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
                *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::
    unique_ptr<draco::SequentialNormalAttributeDecoder,_std::default_delete<draco::SequentialNormalAttributeDecoder>_>
    ::~unique_ptr((unique_ptr<draco::SequentialNormalAttributeDecoder,_std::default_delete<draco::SequentialNormalAttributeDecoder>_>
                   *)in_stack_ffffffffffffffa0);
    break;
  default:
    std::
    unique_ptr<draco::SequentialAttributeDecoder,std::default_delete<draco::SequentialAttributeDecoder>>
    ::unique_ptr<std::default_delete<draco::SequentialAttributeDecoder>,void>
              ((unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
                *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return (__uniq_ptr_data<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>,_true,_true>
          )(tuple<draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
            )in_RDI.
             super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
             .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SequentialAttributeDecoder>
SequentialAttributeDecodersController::CreateSequentialDecoder(
    uint8_t decoder_type) {
  switch (decoder_type) {
    case SEQUENTIAL_ATTRIBUTE_ENCODER_GENERIC:
      return std::unique_ptr<SequentialAttributeDecoder>(
          new SequentialAttributeDecoder());
    case SEQUENTIAL_ATTRIBUTE_ENCODER_INTEGER:
      return std::unique_ptr<SequentialAttributeDecoder>(
          new SequentialIntegerAttributeDecoder());
    case SEQUENTIAL_ATTRIBUTE_ENCODER_QUANTIZATION:
      return std::unique_ptr<SequentialAttributeDecoder>(
          new SequentialQuantizationAttributeDecoder());
#ifdef DRACO_NORMAL_ENCODING_SUPPORTED
    case SEQUENTIAL_ATTRIBUTE_ENCODER_NORMALS:
      return std::unique_ptr<SequentialNormalAttributeDecoder>(
          new SequentialNormalAttributeDecoder());
#endif
    default:
      break;
  }
  // Unknown or unsupported decoder type.
  return nullptr;
}